

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

void __thiscall
spirv_cross::Compiler::ActiveBuiltinHandler::add_if_builtin
          (ActiveBuiltinHandler *this,uint32_t id,bool allow_blocks)

{
  Variant *pVVar1;
  BuiltIn BVar2;
  ulong uVar3;
  SPIRVariable *pSVar4;
  Meta *pMVar5;
  SPIRType *type;
  SPIRType *type_00;
  Bitset *decoration_flags;
  Compiler *pCVar6;
  __hashtable *__h;
  uint32_t index;
  ulong uVar7;
  bool bVar8;
  __node_gen_type __node_gen;
  __hashtable *__h_1;
  BuiltIn local_4c;
  Bitset *local_48;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_40;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_38;
  
  pCVar6 = this->compiler;
  uVar3 = (ulong)id;
  if ((uVar3 < (pCVar6->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (pCVar6->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar1[uVar3].type == TypeVariable)) {
    pSVar4 = Variant::get<spirv_cross::SPIRVariable>(pVVar1 + uVar3);
    pCVar6 = this->compiler;
  }
  else {
    pSVar4 = (SPIRVariable *)0x0;
  }
  pMVar5 = ParsedIR::find_meta(&pCVar6->ir,(ID)id);
  if ((pSVar4 != (SPIRVariable *)0x0) && (pMVar5 != (Meta *)0x0)) {
    type = Variant::get<spirv_cross::SPIRType>
                     ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(pSVar4->super_IVariant).field_0xc);
    bVar8 = type->storage != StorageClassInput;
    pCVar6 = this->compiler;
    local_48 = &pCVar6->active_input_builtins + bVar8;
    if ((pMVar5->decoration).builtin == true) {
      BVar2 = (pMVar5->decoration).builtin_type;
      local_4c = BVar2;
      if (BVar2 < 0x40) {
        local_48->lower = local_48->lower | 1L << ((byte)BVar2 & 0x3f);
      }
      else {
        local_40 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&(&pCVar6->active_input_builtins)[bVar8].higher;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  (local_40,&local_4c);
        BVar2 = (pMVar5->decoration).builtin_type;
      }
      handle_builtin(this,type,BVar2,&(pMVar5->decoration).decoration_flags);
    }
    else if (((allow_blocks) &&
             (bVar8 = ParsedIR::has_decoration
                                (&pCVar6->ir,(ID)(type->super_IVariant).self.id,DecorationBlock),
             bVar8)) &&
            (uVar3 = (ulong)(uint)(type->member_types).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                  buffer_size, uVar3 != 0)) {
      local_38 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_48->higher;
      uVar7 = 0;
      do {
        index = (uint32_t)uVar7;
        bVar8 = ParsedIR::has_member_decoration
                          (&this->compiler->ir,(TypeID)(type->super_IVariant).self.id,index,
                           DecorationBuiltIn);
        if (bVar8) {
          type_00 = Variant::get<spirv_cross::SPIRType>
                              ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                               (type->member_types).
                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                               [uVar7].id);
          BVar2 = ParsedIR::get_member_decoration
                            (&this->compiler->ir,(TypeID)(type->super_IVariant).self.id,index,
                             DecorationBuiltIn);
          local_4c = BVar2;
          if (BVar2 < 0x40) {
            local_48->lower = local_48->lower | 1L << ((byte)BVar2 & 0x3f);
          }
          else {
            local_40 = local_38;
            ::std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      (local_38,&local_4c,&local_40);
          }
          decoration_flags =
               ParsedIR::get_member_decoration_bitset
                         (&this->compiler->ir,(TypeID)(type->super_IVariant).self.id,index);
          handle_builtin(this,type_00,BVar2,decoration_flags);
        }
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar7);
    }
  }
  return;
}

Assistant:

void Compiler::ActiveBuiltinHandler::add_if_builtin(uint32_t id, bool allow_blocks)
{
	// Only handle plain variables here.
	// Builtins which are part of a block are handled in AccessChain.
	// If allow_blocks is used however, this is to handle initializers of blocks,
	// which implies that all members are written to.

	auto *var = compiler.maybe_get<SPIRVariable>(id);
	auto *m = compiler.ir.find_meta(id);
	if (var && m)
	{
		auto &type = compiler.get<SPIRType>(var->basetype);
		auto &decorations = m->decoration;
		auto &flags = type.storage == StorageClassInput ?
		              compiler.active_input_builtins : compiler.active_output_builtins;
		if (decorations.builtin)
		{
			flags.set(decorations.builtin_type);
			handle_builtin(type, decorations.builtin_type, decorations.decoration_flags);
		}
		else if (allow_blocks && compiler.has_decoration(type.self, DecorationBlock))
		{
			uint32_t member_count = uint32_t(type.member_types.size());
			for (uint32_t i = 0; i < member_count; i++)
			{
				if (compiler.has_member_decoration(type.self, i, DecorationBuiltIn))
				{
					auto &member_type = compiler.get<SPIRType>(type.member_types[i]);
					BuiltIn builtin = BuiltIn(compiler.get_member_decoration(type.self, i, DecorationBuiltIn));
					flags.set(builtin);
					handle_builtin(member_type, builtin, compiler.get_member_decoration_bitset(type.self, i));
				}
			}
		}
	}
}